

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::AggregateType::AggregateType(AggregateType *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__AggregateType_00218348;
  this->m_ui8Kind = '\0';
  this->m_ui8Domain = '\0';
  this->m_ui16Country = 0;
  this->m_ui8Category = '\0';
  this->m_ui8SubCategory = '\0';
  this->m_ui8Specific = '\0';
  this->m_ui8Extra = '\0';
  return;
}

Assistant:

AggregateType::AggregateType() :
    m_ui8Kind( 0 ),
    m_ui8Domain( 0 ),
    m_ui16Country( 0 ),
    m_ui8Category( 0 ),
    m_ui8SubCategory( 0 ),
    m_ui8Specific( 0 ),
    m_ui8Extra( 0 )
{
}